

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::RgbaOutputFile::ToYca::decimateChromaVertAndWriteScanLine(ToYca *this)

{
  int iVar1;
  Rgba *in_RDI;
  Rgba *unaff_retaddr;
  uint in_stack_0000000c;
  Rgba *in_stack_00000060;
  Rgba **in_stack_00000068;
  int in_stack_00000074;
  int in_stack_0000028c;
  OutputFile *in_stack_00000290;
  Rgba *pRVar2;
  
  pRVar2 = in_RDI;
  if (((ulong)in_RDI[8] & 1) == 0) {
    RgbaYca::decimateChromaVert(in_stack_00000074,in_stack_00000068,in_stack_00000060);
  }
  else {
    iVar1._0_2_ = in_RDI[7].r;
    iVar1._2_2_ = in_RDI[7].g;
    memcpy((void *)in_RDI[0x27],(void *)in_RDI[0x19],(long)iVar1 << 3);
  }
  if (((in_RDI[6].r._h & 1) != 0) && ((in_RDI[6].r._h & 0x100) != 0)) {
    RgbaYca::roundYCA(this._4_4_,(uint)this,in_stack_0000000c,unaff_retaddr,pRVar2);
  }
  OutputFile::writePixels(in_stack_00000290,in_stack_0000028c);
  return;
}

Assistant:

void
RgbaOutputFile::ToYca::decimateChromaVertAndWriteScanLine ()
{
    if (_linesConverted & 1)
        memcpy (_tmpBuf, _buf[N2], _width * sizeof (Rgba));
    else
        decimateChromaVert (_width, _buf, _tmpBuf);

    if (_writeY && _writeC)
        roundYCA (_width, _roundY, _roundC, _tmpBuf, _tmpBuf);

    _outputFile.writePixels (1);
}